

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int explist1(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *in_RSI;
  int n;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 1;
  expr((LexState *)in_RSI,(expdesc *)CONCAT44(1,in_stack_ffffffffffffffe8));
  while( true ) {
    iVar1 = testnext((LexState *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),0);
    if (iVar1 == 0) break;
    luaK_exp2nextreg(in_RSI,(expdesc *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    expr((LexState *)in_RSI,(expdesc *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static int explist1(LexState*ls,expdesc*v){
int n=1;
expr(ls,v);
while(testnext(ls,',')){
luaK_exp2nextreg(ls->fs,v);
expr(ls,v);
n++;
}
return n;
}